

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O0

Aig_Man_t * Saig_ManRetimeForwardOne(Aig_Man_t *p,int *pnRegFixed,int *pnRegMoves)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t *pAVar4;
  Aig_Man_t *pAVar5;
  int local_44;
  int i;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vCut;
  Aig_Man_t *pNew;
  int *pnRegMoves_local;
  int *pnRegFixed_local;
  Aig_Man_t *p_local;
  
  Saig_ManMarkAutonomous(p);
  Aig_ManIncrementTravId(p);
  *pnRegFixed = 0;
  for (local_44 = 0; iVar1 = Saig_ManRegNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pVVar3 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pVVar3,local_44 + iVar1);
    iVar1 = Aig_ObjIsTravIdPrevious(p,pAVar2);
    if (iVar1 == 0) {
      *pnRegFixed = *pnRegFixed + 1;
    }
    else {
      Aig_ObjSetTravIdCurrent(p,pAVar2);
    }
  }
  *pnRegMoves = 0;
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_44);
    if ((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) {
      pAVar4 = Aig_ObjFanin0(pAVar2);
      iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar4);
      if (iVar1 != 0) {
        pAVar4 = Aig_ObjFanin1(pAVar2);
        iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar4);
        if (iVar1 != 0) {
          Aig_ObjSetTravIdCurrent(p,pAVar2);
          *pnRegMoves = *pnRegMoves + 1;
        }
      }
    }
  }
  for (local_44 = 0; iVar1 = Saig_ManRegNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pVVar3 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pVVar3,local_44 + iVar1);
    Aig_ObjSetTravIdCurrent(p,pAVar2);
  }
  pVVar3 = Vec_PtrAlloc(1000);
  Aig_ManIncrementTravId(p);
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_44);
    if ((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsTravIdPrevious(p,pAVar2), iVar1 == 0)) {
      pAVar4 = Aig_ObjFanin0(pAVar2);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsTravIdPrevious(p,pAVar4), iVar1 != 0)) {
        Vec_PtrPush(pVVar3,pAVar4);
        Aig_ObjSetTravIdCurrent(p,pAVar4);
      }
      pAVar2 = Aig_ObjFanin1(pAVar2);
      if ((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsTravIdPrevious(p,pAVar2), iVar1 != 0)) {
        Vec_PtrPush(pVVar3,pAVar2);
        Aig_ObjSetTravIdCurrent(p,pAVar2);
      }
    }
  }
  pAVar5 = Saig_ManRetimeDupForward(p,pVVar3);
  Vec_PtrFree(pVVar3);
  return pAVar5;
}

Assistant:

Aig_Man_t * Saig_ManRetimeForwardOne( Aig_Man_t * p, int * pnRegFixed, int * pnRegMoves )
{
    Aig_Man_t * pNew;
    Vec_Ptr_t * vCut;
    Aig_Obj_t * pObj, * pFanin;
    int i;
    // mark the retimable nodes
    Saig_ManMarkAutonomous( p );
    // mark the retimable registers with the fresh trav ID
    Aig_ManIncrementTravId( p );
    *pnRegFixed = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( Aig_ObjIsTravIdPrevious(p, pObj) )
            Aig_ObjSetTravIdCurrent(p, pObj);
        else
            (*pnRegFixed)++;
    // mark all the nodes that can be retimed forward
    *pnRegMoves = 0;
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(p, Aig_ObjFanin0(pObj)) && Aig_ObjIsTravIdCurrent(p, Aig_ObjFanin1(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, pObj);
            (*pnRegMoves)++;
        }
    // mark the remaining registers
    Saig_ManForEachLo( p, pObj, i )
        Aig_ObjSetTravIdCurrent(p, pObj);
    // find the cut (all such marked objects that fanout into unmarked nodes)
    vCut = Vec_PtrAlloc( 1000 );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsTravIdPrevious(p, pObj) )
            continue;
        pFanin = Aig_ObjFanin0(pObj);
        if ( pFanin && Aig_ObjIsTravIdPrevious(p, pFanin) )
        {
            Vec_PtrPush( vCut, pFanin );
            Aig_ObjSetTravIdCurrent( p, pFanin );
        }
        pFanin = Aig_ObjFanin1(pObj);
        if ( pFanin && Aig_ObjIsTravIdPrevious(p, pFanin) )
        {
            Vec_PtrPush( vCut, pFanin );
            Aig_ObjSetTravIdCurrent( p, pFanin );
        }
    }
    // finally derive the new manager
    pNew = Saig_ManRetimeDupForward( p, vCut );
    Vec_PtrFree( vCut );
    return pNew;
}